

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

void findEventBits(int pi)

{
  evtCallback_t *peVar1;
  uint p2;
  
  p2 = 0;
  for (peVar1 = geCallBackFirst; peVar1 != (evtCallback_t *)0x0; peVar1 = peVar1->next) {
    if (peVar1->pi == pi) {
      p2 = p2 | 1 << ((byte)peVar1->event & 0x1f);
    }
  }
  if (p2 == gEventBits[pi]) {
    return;
  }
  gEventBits[pi] = p2;
  pigpio_command(pi,0x73,gPigHandle[pi],p2,1);
  return;
}

Assistant:

static void findEventBits(int pi)
{
   evtCallback_t *ep;
   uint32_t bits = 0;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->pi == pi) bits |= (1<<(ep->event));
      ep = ep->next;
   }

   if (bits != gEventBits[pi])
   {
      gEventBits[pi] = bits;
      pigpio_command(pi, PI_CMD_EVM, gPigHandle[pi], gEventBits[pi], 1);
   }
}